

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O0

void * __thiscall asmjit::VMemMgr::alloc(VMemMgr *this,size_t size,uint32_t type)

{
  int in_EDX;
  size_t unaff_retaddr;
  undefined4 in_stack_00000008;
  size_t in_stack_00000068;
  VMemMgr *in_stack_00000070;
  undefined8 local_8;
  
  if (in_EDX == 1) {
    local_8 = vMemMgrAllocPermanent((VMemMgr *)CONCAT44(type,in_stack_00000008),unaff_retaddr);
  }
  else {
    local_8 = vMemMgrAllocFreeable(in_stack_00000070,in_stack_00000068);
  }
  return local_8;
}

Assistant:

void* VMemMgr::alloc(size_t size, uint32_t type) noexcept {
  if (type == kAllocPermanent)
    return vMemMgrAllocPermanent(this, size);
  else
    return vMemMgrAllocFreeable(this, size);
}